

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O1

Token * __thiscall EOPlus::Lexer::ReadToken(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  int iVar2;
  _Elt_pointer pTVar3;
  Lexer *this_00;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  runtime_error *this_01;
  Token *__return_storage_ptr___00;
  char c;
  Token token;
  char local_191;
  Token *local_190;
  Lexer *local_188;
  TokenType local_180;
  undefined1 local_178 [16];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  bool local_148;
  bool bStack_147;
  bool bStack_146;
  bool bStack_145;
  bool bStack_144;
  undefined3 uStack_143;
  var_type local_140;
  int local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  undefined1 local_128 [24];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  bool local_f0;
  bool bStack_ef;
  bool bStack_ee;
  bool bStack_ed;
  bool bStack_ec;
  undefined3 uStack_eb;
  var_type local_e8;
  int local_e0;
  code *local_d8 [2];
  code *local_c8;
  code *pcStack_c0;
  variant local_b0;
  variant local_70;
  
  util::variant::variant(&local_70);
  local_180 = Invalid;
  local_178._4_4_ = local_70._4_4_;
  local_178._0_4_ = local_70.val_int;
  local_178._12_4_ = local_70.val_float._4_4_;
  local_178._8_4_ = local_70.val_float._0_4_;
  local_168._M_p = (pointer)&local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_70.val_string._M_dataplus._M_p,
             local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
  local_140 = local_70.type;
  local_148 = local_70.val_bool;
  bStack_147 = local_70.cache_val[0];
  bStack_146 = local_70.cache_val[1];
  bStack_145 = local_70.cache_val[2];
  bStack_144 = local_70.cache_val[3];
  uStack_143 = local_70._53_3_;
  local_138 = 0;
  local_190 = __return_storage_ptr__;
  local_188 = this;
  local_130 = &local_158;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.val_string._M_dataplus._M_p != &local_70.val_string.field_2) {
    operator_delete(local_70.val_string._M_dataplus._M_p,
                    local_70.val_string.field_2._M_allocated_capacity + 1);
  }
  local_191 = '\0';
  do {
    local_d8[1] = (code *)0x0;
    local_d8[0] = ctype_whitespace;
    pcStack_c0 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_c8 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar4 = GetCharIf(local_188,&local_191,(function<bool_(char)> *)local_d8);
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    this_00 = local_188;
  } while (bVar4);
  pTVar3 = (local_188->token_buffer).c.
           super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((local_188->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur == pTVar3) {
    uVar6 = std::istream::peek();
    if (uVar6 == 0xffffffff) {
      util::variant::variant(&local_b0);
      local_128._0_4_ = EndOfFile;
      local_128._8_4_ = local_b0.val_int;
      local_128._12_4_ = local_b0._4_4_;
      local_128._16_4_ = local_b0.val_float._0_4_;
      local_128._20_4_ = local_b0.val_float._4_4_;
      local_110._M_p = (pointer)&local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_b0.val_string._M_dataplus._M_p,
                 local_b0.val_string._M_dataplus._M_p + local_b0.val_string._M_string_length);
      __return_storage_ptr___00 = local_190;
      local_e8 = local_b0.type;
      local_f0 = local_b0.val_bool;
      bStack_ef = local_b0.cache_val[0];
      bStack_ee = local_b0.cache_val[1];
      bStack_ed = local_b0.cache_val[2];
      bStack_ec = local_b0.cache_val[3];
      uStack_eb = local_b0._53_3_;
      local_e0 = 0;
      local_180 = local_128._0_4_;
      local_178._4_4_ = local_128._12_4_;
      local_178._0_4_ = local_128._8_4_;
      local_178._8_8_ = CONCAT44(local_128._20_4_,local_128._16_4_);
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_110);
      local_148 = local_f0;
      bStack_147 = bStack_ef;
      bStack_146 = bStack_ee;
      bStack_145 = bStack_ed;
      bStack_144 = bStack_ec;
      uStack_143 = uStack_eb;
      local_140 = local_e8;
      local_138 = local_e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.val_string._M_dataplus._M_p != &local_b0.val_string.field_2) {
        operator_delete(local_b0.val_string._M_dataplus._M_p,
                        local_b0.val_string.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cVar5 = (char)uVar6;
      local_191 = cVar5;
      if ((int)cVar5 - 0x30U < 10) {
        ReadNumber((Token *)local_128,this_00);
LAB_0013d24e:
        local_180 = local_128._0_4_;
        local_178._4_4_ = local_128._12_4_;
        local_178._0_4_ = local_128._8_4_;
        local_178._8_8_ = CONCAT44(local_128._20_4_,local_128._16_4_);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_110);
        local_148 = local_f0;
        bStack_147 = bStack_ef;
        bStack_146 = bStack_ee;
        bStack_145 = bStack_ed;
        bStack_144 = bStack_ec;
        uStack_143 = uStack_eb;
        local_140 = local_e8;
        local_138 = local_e0;
        __return_storage_ptr___00 = local_190;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != &local_100) {
LAB_0013d2a6:
          _local_148 = _local_f0;
          local_140 = local_e8;
          local_138 = local_e0;
          operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        }
      }
      else {
        iVar7 = isalpha((int)cVar5);
        __return_storage_ptr___00 = local_190;
        if (((iVar7 != 0) || (cVar5 == '$')) || ((uVar6 & 0xff) == 0x5f)) {
          ReadIdentifier((Token *)local_128,this_00);
          goto LAB_0013d24e;
        }
        pcVar9 = ";{}.,";
        do {
          cVar1 = *pcVar9;
          if (cVar1 == cVar5) break;
          pcVar9 = pcVar9 + 1;
        } while (cVar1 != '\0');
        if (cVar1 != '\0') {
          ReadSymbol((Token *)local_128,this_00);
          goto LAB_0013d24e;
        }
        pcVar9 = "()&|=!<>+-*/%&|!";
        do {
          cVar1 = *pcVar9;
          if (cVar1 == cVar5) break;
          pcVar9 = pcVar9 + 1;
        } while (cVar1 != '\0');
        if (cVar1 == '\0') {
          if (cVar5 != '\"') goto LAB_0013d2b6;
          ReadString((Token *)local_128,local_188);
          local_180 = local_128._0_4_;
          local_178._4_4_ = local_128._12_4_;
          local_178._0_4_ = local_128._8_4_;
          local_178._8_8_ = CONCAT44(local_128._20_4_,local_128._16_4_);
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_110);
          local_148 = local_f0;
          bStack_147 = bStack_ef;
          bStack_146 = bStack_ee;
          bStack_145 = bStack_ed;
          bStack_144 = bStack_ec;
          uStack_143 = uStack_eb;
          local_140 = local_e8;
          local_138 = local_e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p == &local_100) goto LAB_0013d2b6;
          goto LAB_0013d2a6;
        }
        ReadOperator((Token *)local_128,this_00);
        local_180 = local_128._0_4_;
        local_178._4_4_ = local_128._12_4_;
        local_178._0_4_ = local_128._8_4_;
        local_178._8_8_ = CONCAT44(local_128._20_4_,local_128._16_4_);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_110);
        __return_storage_ptr___00 = local_190;
        local_148 = local_f0;
        bStack_147 = bStack_ef;
        bStack_146 = bStack_ee;
        bStack_145 = bStack_ed;
        bStack_144 = bStack_ec;
        uStack_143 = uStack_eb;
        local_140 = local_e8;
        local_138 = local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != &local_100) {
          operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        }
        iVar7 = util::variant::GetInt((variant *)local_178);
        if ((iVar7 == 0xf) && (cVar5 = std::istream::peek(), cVar5 == '/')) {
          while (local_191 != '\n') {
            GetChar(local_188,&local_191);
          }
          ReadToken(__return_storage_ptr___00,local_188);
          goto LAB_0013d32c;
        }
      }
LAB_0013d2b6:
      if (local_180 == Invalid) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x20);
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Unknown token","");
        iVar7 = local_188->row;
        iVar2 = local_188->col;
        std::runtime_error::runtime_error(this_01,(string *)local_128);
        *(int *)(this_01 + 0x10) = iVar7;
        *(undefined ***)this_01 = &PTR__runtime_error_001d3678;
        *(int *)(this_01 + 0x18) = iVar2;
        __cxa_throw(this_01,&Lexer_Error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    __return_storage_ptr___00->type = local_180;
    *(undefined8 *)&__return_storage_ptr___00->data = local_178._0_8_;
    (__return_storage_ptr___00->data).val_float = (double)local_178._8_8_;
    paVar8 = &(__return_storage_ptr___00->data).val_string.field_2;
    (__return_storage_ptr___00->data).val_string._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_180 = pTVar3->type;
    local_178._0_4_ = (pTVar3->data).val_int;
    local_178._4_4_ = *(undefined4 *)&(pTVar3->data).field_0x4;
    local_178._8_8_ = (pTVar3->data).val_float;
    std::__cxx11::string::_M_assign((string *)&local_168);
    local_140 = (pTVar3->data).type;
    local_148 = (pTVar3->data).val_bool;
    bStack_147 = (pTVar3->data).cache_val[0];
    bStack_146 = (pTVar3->data).cache_val[1];
    bStack_145 = (pTVar3->data).cache_val[2];
    bStack_144 = (pTVar3->data).cache_val[3];
    uStack_143 = *(undefined3 *)&(pTVar3->data).field_0x35;
    local_138 = pTVar3->newlines;
    std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::pop_front(&(this_00->token_buffer).c)
    ;
    local_190->type = local_180;
    *(undefined8 *)&local_190->data = local_178._0_8_;
    (local_190->data).val_float = (double)local_178._8_8_;
    paVar8 = &(local_190->data).val_string.field_2;
    (local_190->data).val_string._M_dataplus._M_p = (pointer)paVar8;
    __return_storage_ptr___00 = local_190;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p == &local_158) {
    paVar8->_M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    *(undefined8 *)((long)paVar8 + 8) = local_158._8_8_;
  }
  else {
    (__return_storage_ptr___00->data).val_string._M_dataplus._M_p = local_168._M_p;
    (__return_storage_ptr___00->data).val_string.field_2._M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
  }
  (__return_storage_ptr___00->data).val_string._M_string_length = local_160;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  (__return_storage_ptr___00->data).type = local_140;
  (__return_storage_ptr___00->data).val_bool = local_148;
  (__return_storage_ptr___00->data).cache_val[0] = bStack_147;
  (__return_storage_ptr___00->data).cache_val[1] = bStack_146;
  (__return_storage_ptr___00->data).cache_val[2] = bStack_145;
  (__return_storage_ptr___00->data).cache_val[3] = bStack_144;
  *(undefined3 *)&(__return_storage_ptr___00->data).field_0x35 = uStack_143;
  __return_storage_ptr___00->newlines = local_138;
  local_168._M_p = (pointer)&local_158;
LAB_0013d32c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

Token Lexer::ReadToken()
	{
		Token token;

		char c = '\0';

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_digit(c))
			{
				token = this->ReadNumber();
			}
			else if (ctype_ident_start(c))
			{
				token = this->ReadIdentifier();
			}
			else if (ctype_symbol(c))
			{
				token = this->ReadSymbol();
			}
			else if (ctype_op(c)) // Assumes '/' is a valid operator
			{
				char cc = '\0';
				token = this->ReadOperator();

				if (int(token.data) == UOP2('/', '\0') && this->PeekChar(cc) && cc == '/') // Line-comments
				{
					while (c != '\n')
						this->GetChar(c);

					return this->ReadToken();
				}
			}
			else if (c == '"')
			{
				token = this->ReadString();
			}

			if (token.type == Token::Invalid)
				throw Lexer_Error("Unknown token", this->row, this->col);

			return token;
		}

		token = Token(Token::EndOfFile);

		return token;
	}